

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  long *plVar2;
  curltime older;
  curltime cVar3;
  int iVar4;
  timediff_t tVar5;
  ulong uVar6;
  long *plVar7;
  curltime newer;
  curltime t;
  time_t local_58;
  ulong local_50;
  long local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  
  pvVar1 = cf->ctx;
  plVar7 = (long *)((long)pvVar1 + 0x30);
  local_50 = 0;
  local_58 = 0;
  for (uVar6 = 0; uVar6 < *(ulong *)((long)pvVar1 + 0x98); uVar6 = uVar6 + 1) {
    plVar2 = (long *)*plVar7;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if (plVar2 != (long *)0x0) {
      iVar4 = (**(code **)(*plVar2 + 0x70))(plVar2,data,query,0,&local_48);
      if (iVar4 == 0) {
        newer.tv_usec = uStack_40;
        newer.tv_sec = local_48;
        if (uStack_40 != 0 || local_48 != 0) {
          older._8_8_ = local_50;
          older.tv_sec = local_58;
          newer._12_4_ = 0;
          tVar5 = Curl_timediff_us(newer,older);
          if (0 < tVar5) {
            local_58 = local_48;
            local_50 = (ulong)uStack_40;
          }
        }
      }
    }
    plVar7 = plVar7 + 7;
  }
  cVar3._8_8_ = local_50;
  cVar3.tv_sec = local_58;
  return cVar3;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ctx->baller_count; i++) {
    struct Curl_cfilter *cfb = ctx->ballers[i].cf;
    memset(&t, 0, sizeof(t));
    if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}